

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_draw_triangle_strip(rf_vec2 *points,int points_count,rf_color color)

{
  _Bool _Var1;
  long local_28;
  rf_int i;
  int points_count_local;
  rf_vec2 *points_local;
  rf_color color_local;
  
  if (2 < points_count) {
    _Var1 = rf_gfx_check_buffer_limit(points_count);
    if (_Var1) {
      rf_gfx_draw();
    }
    rf_gfx_begin(RF_TRIANGLES);
    points_local._4_1_ = color.r;
    points_local._5_1_ = color.g;
    points_local._6_1_ = color.b;
    points_local._7_1_ = color.a;
    rf_gfx_color4ub(points_local._4_1_,points_local._5_1_,points_local._6_1_,points_local._7_1_);
    for (local_28 = 2; local_28 < points_count; local_28 = local_28 + 1) {
      if (local_28 % 2 == 0) {
        rf_gfx_vertex2f(points[local_28].x,points[local_28].y);
        rf_gfx_vertex2f(points[local_28 + -2].x,points[local_28 + -2].y);
        rf_gfx_vertex2f(points[local_28 + -1].x,points[local_28 + -1].y);
      }
      else {
        rf_gfx_vertex2f(points[local_28].x,points[local_28].y);
        rf_gfx_vertex2f(points[local_28 + -1].x,points[local_28 + -1].y);
        rf_gfx_vertex2f(points[local_28 + -2].x,points[local_28 + -2].y);
      }
    }
    rf_gfx_end();
  }
  return;
}

Assistant:

RF_API void rf_draw_triangle_strip(rf_vec2 *points, int points_count, rf_color color)
{
    if (points_count >= 3)
    {
        if (rf_gfx_check_buffer_limit(points_count)) rf_gfx_draw();

        rf_gfx_begin(RF_TRIANGLES);
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);

        for (rf_int i = 2; i < points_count; i++)
        {
            if ((i%2) == 0)
            {
                rf_gfx_vertex2f(points[i].x, points[i].y);
                rf_gfx_vertex2f(points[i - 2].x, points[i - 2].y);
                rf_gfx_vertex2f(points[i - 1].x, points[i - 1].y);
            }
            else
            {
                rf_gfx_vertex2f(points[i].x, points[i].y);
                rf_gfx_vertex2f(points[i - 1].x, points[i - 1].y);
                rf_gfx_vertex2f(points[i - 2].x, points[i - 2].y);
            }
        }
        rf_gfx_end();
    }
}